

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O1

size_t __thiscall
axl::err::Error::format_va(Error *this,Guid *guid,uint_t code,char *formatString,axl_va_list *va)

{
  ErrorHdr *pEVar1;
  undefined8 uVar2;
  size_t size;
  size_t packSize;
  PackerSeq packer;
  size_t local_e0;
  PackerSeq local_d8;
  axl_va_list local_b8;
  axl_va_list local_98;
  axl_va_list local_70;
  axl_va_list local_50;
  
  local_d8.super_Packer._vptr_Packer = (_func_int **)&PTR_pack_va_0014ca78;
  local_d8.m_sequence.super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>.
  m_p = (Packer **)0x0;
  local_d8.m_sequence.super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>.
  m_hdr = (Hdr *)0x0;
  local_d8.m_sequence.super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>.
  m_count = 0;
  sl::Array<axl::sl::Packer*,axl::sl::ArrayDetails<axl::sl::Packer*>>::
  setCountImpl<axl::sl::SimpleArrayDetails<axl::sl::Packer*>::Construct>
            ((Array<axl::sl::Packer*,axl::sl::ArrayDetails<axl::sl::Packer*>> *)&local_d8.m_sequence
             ,0);
  sl::PackerSeq::appendFormat(&local_d8,formatString);
  local_98._0_8_ = *(undefined8 *)va;
  local_98._8_8_ = *(undefined8 *)&va->field_0x8;
  local_98._16_8_ = *(undefined8 *)&va->field_0x10;
  local_98.m_isInitialized = true;
  sl::PackerSeq::pack_va(&local_50,&local_d8,(void *)0x0,&local_e0,&local_98);
  if (local_50.m_isInitialized == true) {
    local_50.m_isInitialized = false;
  }
  if (local_98.m_isInitialized == true) {
    local_98.m_isInitialized = false;
  }
  size = local_e0 + 0x18;
  rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
            (&this->super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>,size,
             false);
  pEVar1 = (this->super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>).
           super_ErrorRef.super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_p;
  if (pEVar1 == (ErrorHdr *)0x0) {
    size = 0xffffffffffffffff;
  }
  else {
    pEVar1->m_size = (uint32_t)size;
    uVar2 = *(undefined8 *)((long)&guid->field_0 + 8);
    *(undefined8 *)&(pEVar1->m_guid).field_0 = *(undefined8 *)&guid->field_0;
    *(undefined8 *)((long)&(pEVar1->m_guid).field_0 + 8) = uVar2;
    pEVar1 = (this->super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>).
             super_ErrorRef.super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_p;
    pEVar1->m_code = code;
    local_b8._0_8_ = *(undefined8 *)va;
    local_b8._8_8_ = *(undefined8 *)&va->field_0x8;
    local_b8._16_8_ = *(undefined8 *)&va->field_0x10;
    local_b8.m_isInitialized = true;
    sl::PackerSeq::pack_va(&local_70,&local_d8,pEVar1 + 1,&local_e0,&local_b8);
    if (local_70.m_isInitialized == true) {
      local_70.m_isInitialized = false;
    }
    if (local_b8.m_isInitialized == true) {
      local_b8.m_isInitialized = false;
    }
  }
  local_d8.super_Packer._vptr_Packer = (_func_int **)&PTR_pack_va_0014ca78;
  sl::ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>::release
            (&local_d8.m_sequence.
              super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>);
  return size;
}

Assistant:

size_t
Error::format_va(
	const sl::Guid& guid,
	uint_t code,
	const char* formatString,
	axl_va_list va
) {
	sl::PackerSeq packer;
	packer.format(formatString);

	size_t packSize;
	packer.pack_va(NULL, &packSize, va);

	size_t size = sizeof(ErrorHdr) + packSize;

	createBuffer(size);
	if (!m_p)
		return -1;

	m_p->m_size = (uint32_t)size;
	m_p->m_guid = guid;
	m_p->m_code = code;

	packer.pack_va(m_p + 1, &packSize, va);
	return size;
}